

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module-utils.h
# Opt level: O2

Function * __thiscall
wasm::ModuleUtils::copyFunction(ModuleUtils *this,Function *func,Module *out,Name newName)

{
  Module *pMVar1;
  undefined8 uVar2;
  int iVar3;
  undefined4 extraout_var;
  Function *pFVar4;
  ModuleUtils *pMVar5;
  Module *pMStack_48;
  Name newName_local;
  __single_object ret;
  
  pMStack_48 = out;
  newName_local.super_IString.str._M_len = newName.super_IString.str._M_len;
  std::make_unique<wasm::Function>();
  pMVar5 = (ModuleUtils *)&pMStack_48;
  if (newName.super_IString.str._M_len == 0) {
    pMVar5 = this;
  }
  pMVar1 = *(Module **)(pMVar5 + 8);
  *(Module **)newName_local.super_IString.str._M_str = *(Module **)pMVar5;
  *(Module **)(newName_local.super_IString.str._M_str + 8) = pMVar1;
  *(undefined8 *)(newName_local.super_IString.str._M_str + 0x38) = *(undefined8 *)(this + 0x38);
  std::vector<wasm::Type,_std::allocator<wasm::Type>_>::operator=
            ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)
             (newName_local.super_IString.str._M_str + 0x48),
             (vector<wasm::Type,_std::allocator<wasm::Type>_> *)(this + 0x48));
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_wasm::Name>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::operator=((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_wasm::Name>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
               *)(newName_local.super_IString.str._M_str + 0x70),
              (_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_wasm::Name>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
               *)(this + 0x70));
  std::
  _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::operator=((_Hashtable<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
               *)(newName_local.super_IString.str._M_str + 0xa8),
              (_Hashtable<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
               *)(this + 0xa8));
  std::
  _Hashtable<wasm::Expression_*,_std::pair<wasm::Expression_*const,_wasm::Function::DebugLocation>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Function::DebugLocation>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::operator=((_Hashtable<wasm::Expression_*,_std::pair<wasm::Expression_*const,_wasm::Function::DebugLocation>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Function::DebugLocation>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
               *)(newName_local.super_IString.str._M_str + 0xe0),
              (_Hashtable<wasm::Expression_*,_std::pair<wasm::Expression_*const,_wasm::Function::DebugLocation>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Function::DebugLocation>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
               *)(this + 0xe0));
  iVar3 = ExpressionManipulator::copy(*(EVP_PKEY_CTX **)(this + 0x60),(EVP_PKEY_CTX *)func);
  *(ulong *)(newName_local.super_IString.str._M_str + 0x60) = CONCAT44(extraout_var,iVar3);
  uVar2 = *(undefined8 *)(this + 0x20);
  *(undefined8 *)(newName_local.super_IString.str._M_str + 0x18) = *(undefined8 *)(this + 0x18);
  *(undefined8 *)(newName_local.super_IString.str._M_str + 0x20) = uVar2;
  uVar2 = *(undefined8 *)(this + 0x30);
  *(undefined8 *)(newName_local.super_IString.str._M_str + 0x28) = *(undefined8 *)(this + 0x28);
  *(undefined8 *)(newName_local.super_IString.str._M_str + 0x30) = uVar2;
  if (*(long *)(this + 0x68) == 0) {
    pFVar4 = (Function *)wasm::Module::addFunction((unique_ptr *)func);
    std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::~unique_ptr
              ((unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)
               &newName_local.super_IString.str._M_str);
    return pFVar4;
  }
  __assert_fail("!func->stackIR",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/ir/module-utils.h"
                ,0x2d,"Function *wasm::ModuleUtils::copyFunction(Function *, Module &, Name)");
}

Assistant:

inline Function*
copyFunction(Function* func, Module& out, Name newName = Name()) {
  auto ret = std::make_unique<Function>();
  ret->name = newName.is() ? newName : func->name;
  ret->type = func->type;
  ret->vars = func->vars;
  ret->localNames = func->localNames;
  ret->localIndices = func->localIndices;
  ret->debugLocations = func->debugLocations;
  ret->body = ExpressionManipulator::copy(func->body, out);
  ret->module = func->module;
  ret->base = func->base;
  // TODO: copy Stack IR
  assert(!func->stackIR);
  return out.addFunction(std::move(ret));
}